

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlRegStateAddTrans(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr state,xmlRegAtomPtr atom,
                        xmlRegStatePtr target,int counter,int count)

{
  int iVar1;
  int iVar2;
  long lVar3;
  xmlRegTrans *pxVar4;
  int *piVar5;
  long lVar6;
  char *extra;
  
  if (state == (xmlRegStatePtr)0x0) {
    ctxt->error = 0x5aa;
    extra = "add state: state is NULL";
  }
  else {
    if (target != (xmlRegStatePtr)0x0) {
      lVar3 = (long)state->nbTrans;
      if (0 < lVar3) {
        lVar6 = lVar3 + 1;
        piVar5 = &state->trans[lVar3 + -1].count;
        do {
          if ((((((xmlRegTrans *)(piVar5 + -4))->atom == atom) && (piVar5[-2] == target->no)) &&
              (piVar5[-1] == counter)) && (*piVar5 == count)) {
            return;
          }
          lVar6 = lVar6 + -1;
          piVar5 = piVar5 + -6;
        } while (1 < lVar6);
      }
      iVar1 = state->maxTrans;
      if ((long)iVar1 == 0) {
        state->maxTrans = 8;
        pxVar4 = (xmlRegTrans *)(*xmlMalloc)(0xc0);
        state->trans = pxVar4;
        if (pxVar4 == (xmlRegTrans *)0x0) {
          xmlRegexpErrMemory(ctxt,"adding transition");
          state->maxTrans = 0;
          return;
        }
      }
      else if (iVar1 <= state->nbTrans) {
        state->maxTrans = iVar1 * 2;
        pxVar4 = (xmlRegTrans *)(*xmlRealloc)(state->trans,(long)iVar1 * 0x30);
        if (pxVar4 == (xmlRegTrans *)0x0) {
          xmlRegexpErrMemory(ctxt,"adding transition");
          state->maxTrans = state->maxTrans / 2;
          return;
        }
        state->trans = pxVar4;
      }
      pxVar4 = state->trans;
      iVar1 = state->nbTrans;
      pxVar4[iVar1].atom = atom;
      pxVar4[iVar1].to = target->no;
      pxVar4[iVar1].counter = counter;
      pxVar4[iVar1].count = count;
      pxVar4[iVar1].nd = 0;
      state->nbTrans = iVar1 + 1;
      iVar1 = state->no;
      iVar2 = target->maxTransTo;
      if ((long)iVar2 == 0) {
        target->maxTransTo = 8;
        piVar5 = (int *)(*xmlMalloc)(0x20);
        target->transTo = piVar5;
        if (piVar5 == (int *)0x0) {
          xmlRegexpErrMemory(ctxt,"adding transition");
          target->maxTransTo = 0;
          return;
        }
      }
      else if (iVar2 <= target->nbTransTo) {
        target->maxTransTo = iVar2 * 2;
        piVar5 = (int *)(*xmlRealloc)(target->transTo,(long)iVar2 << 3);
        if (piVar5 == (int *)0x0) {
          xmlRegexpErrMemory(ctxt,"adding transition");
          target->maxTransTo = target->maxTransTo / 2;
          return;
        }
        target->transTo = piVar5;
      }
      target->transTo[target->nbTransTo] = iVar1;
      target->nbTransTo = target->nbTransTo + 1;
      return;
    }
    ctxt->error = 0x5aa;
    extra = "add state: target is NULL";
  }
  xmlRegexpErrCompile(ctxt,extra);
  return;
}

Assistant:

static void
xmlRegStateAddTrans(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr state,
	            xmlRegAtomPtr atom, xmlRegStatePtr target,
		    int counter, int count) {

    int nrtrans;

    if (state == NULL) {
	ERROR("add state: state is NULL");
	return;
    }
    if (target == NULL) {
	ERROR("add state: target is NULL");
	return;
    }
    /*
     * Other routines follow the philosophy 'When in doubt, add a transition'
     * so we check here whether such a transition is already present and, if
     * so, silently ignore this request.
     */

    for (nrtrans = state->nbTrans - 1; nrtrans >= 0; nrtrans--) {
	xmlRegTransPtr trans = &(state->trans[nrtrans]);
	if ((trans->atom == atom) &&
	    (trans->to == target->no) &&
	    (trans->counter == counter) &&
	    (trans->count == count)) {
#ifdef DEBUG_REGEXP_GRAPH
	    printf("Ignoring duplicate transition from %d to %d\n",
		    state->no, target->no);
#endif
	    return;
	}
    }

    if (state->maxTrans == 0) {
	state->maxTrans = 8;
	state->trans = (xmlRegTrans *) xmlMalloc(state->maxTrans *
		                             sizeof(xmlRegTrans));
	if (state->trans == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding transition");
	    state->maxTrans = 0;
	    return;
	}
    } else if (state->nbTrans >= state->maxTrans) {
	xmlRegTrans *tmp;
	state->maxTrans *= 2;
	tmp = (xmlRegTrans *) xmlRealloc(state->trans, state->maxTrans *
		                             sizeof(xmlRegTrans));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt, "adding transition");
	    state->maxTrans /= 2;
	    return;
	}
	state->trans = tmp;
    }
#ifdef DEBUG_REGEXP_GRAPH
    printf("Add trans from %d to %d ", state->no, target->no);
    if (count == REGEXP_ALL_COUNTER)
	printf("all transition\n");
    else if (count >= 0)
	printf("count based %d\n", count);
    else if (counter >= 0)
	printf("counted %d\n", counter);
    else if (atom == NULL)
	printf("epsilon transition\n");
    else if (atom != NULL)
        xmlRegPrintAtom(stdout, atom);
#endif

    state->trans[state->nbTrans].atom = atom;
    state->trans[state->nbTrans].to = target->no;
    state->trans[state->nbTrans].counter = counter;
    state->trans[state->nbTrans].count = count;
    state->trans[state->nbTrans].nd = 0;
    state->nbTrans++;
    xmlRegStateAddTransTo(ctxt, target, state->no);
}